

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::InlineReader::PerformGets(InlineReader *this)

{
  int iVar1;
  ostream *this_00;
  long in_RDI;
  ScopedTimer __var2110;
  InlineReader *in_stack_00000680;
  void *in_stack_ffffffffffffffb8;
  ostream *in_stack_ffffffffffffffc0;
  
  if (PerformGets()::__var110 == '\0') {
    iVar1 = __cxa_guard_acquire(&PerformGets()::__var110);
    if (iVar1 != 0) {
      PerformGets::__var110 = (void *)ps_timer_create_("InlineReader::PerformGets");
      __cxa_guard_release(&PerformGets()::__var110);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (*(int *)(in_RDI + 0xc0) == 5) {
    this_00 = std::operator<<((ostream *)&std::cout,"Inline Reader ");
    in_stack_ffffffffffffffc0 = (ostream *)std::ostream::operator<<(this_00,*(int *)(in_RDI + 0xc4))
    ;
    std::operator<<(in_stack_ffffffffffffffc0,"     PerformGets()\n");
  }
  SetDeferredVariablePointers(in_stack_00000680);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void InlineReader::PerformGets()
{
    PERFSTUBS_SCOPED_TIMER("InlineReader::PerformGets");
    if (m_Verbosity == 5)
    {
        std::cout << "Inline Reader " << m_ReaderRank << "     PerformGets()\n";
    }
    SetDeferredVariablePointers();
}